

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::GetAction,_std::default_delete<wabt::GetAction>_> __thiscall
wabt::MakeUnique<wabt::GetAction,wabt::Location&>(wabt *this,Location *args)

{
  GetAction *this_00;
  Location *args_local;
  
  this_00 = (GetAction *)operator_new(0x98);
  GetAction::GetAction(this_00,args);
  std::unique_ptr<wabt::GetAction,std::default_delete<wabt::GetAction>>::
  unique_ptr<std::default_delete<wabt::GetAction>,void>
            ((unique_ptr<wabt::GetAction,std::default_delete<wabt::GetAction>> *)this,this_00);
  return (__uniq_ptr_data<wabt::GetAction,_std::default_delete<wabt::GetAction>,_true,_true>)
         (__uniq_ptr_data<wabt::GetAction,_std::default_delete<wabt::GetAction>,_true,_true>)this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}